

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack21_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x1fffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x15;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0x3ff) << 0xb | *puVar1;
  out[2] = *puVar2 >> 10 & 0x1fffff;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 0x1f;
  *puVar1 = (in[2] & 0xfffff) << 1 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[2] >> 0x14;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 0x1ff) << 0xc | *puVar1;
  out[5] = *puVar2 >> 9 & 0x1fffff;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[4] & 0x7ffff) << 2 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[4] >> 0x13;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 0xff) << 0xd | *puVar1;
  out[8] = *puVar2 >> 8 & 0x1fffff;
  puVar1 = out + 9;
  *puVar1 = *puVar2 >> 0x1d;
  *puVar1 = (in[6] & 0x3ffff) << 3 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[6] >> 0x12;
  puVar2 = in + 7;
  *puVar1 = (*puVar2 & 0x7f) << 0xe | *puVar1;
  out[0xb] = *puVar2 >> 7 & 0x1fffff;
  puVar1 = out + 0xc;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[8] & 0x1ffff) << 4 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[8] >> 0x11;
  puVar2 = in + 9;
  *puVar1 = (*puVar2 & 0x3f) << 0xf | *puVar1;
  out[0xe] = *puVar2 >> 6 & 0x1fffff;
  puVar1 = out + 0xf;
  *puVar1 = *puVar2 >> 0x1b;
  *puVar1 = (in[10] & 0xffff) << 5 | *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[10] >> 0x10;
  puVar2 = in + 0xb;
  *puVar1 = (*puVar2 & 0x1f) << 0x10 | *puVar1;
  out[0x11] = *puVar2 >> 5 & 0x1fffff;
  puVar1 = out + 0x12;
  *puVar1 = *puVar2 >> 0x1a;
  *puVar1 = (in[0xc] & 0x7fff) << 6 | *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = in[0xc] >> 0xf;
  puVar2 = in + 0xd;
  *puVar1 = (*puVar2 & 0xf) << 0x11 | *puVar1;
  out[0x14] = *puVar2 >> 4 & 0x1fffff;
  puVar1 = out + 0x15;
  *puVar1 = *puVar2 >> 0x19;
  *puVar1 = (in[0xe] & 0x3fff) << 7 | *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = in[0xe] >> 0xe;
  *puVar1 = (in[0xf] & 7) << 0x12 | *puVar1;
  out[0x17] = in[0xf] >> 3 & 0x1fffff;
  return in + 0x10;
}

Assistant:

const uint32_t *__fastunpack21_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 10)) << (21 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 21);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 20)) << (21 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 9)) << (21 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 21);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 19)) << (21 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 8)) << (21 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 21);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 18)) << (21 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 7)) << (21 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 21);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 17)) << (21 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 6)) << (21 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 21);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 16)) << (21 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 5)) << (21 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 21);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 15)) << (21 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 4)) << (21 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 21);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 14)) << (21 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 3)) << (21 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 21);
  out++;

  return in + 1;
}